

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_http_mark_sse(lws *wsi)

{
  if (wsi != (lws *)0x0) {
    lws_http_headers_detach(wsi);
    lws_mux_mark_immortal(wsi);
    if ((*(ulong *)&wsi->field_0x46e & 2) != 0) {
      *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e | 0x20;
    }
  }
  return 0;
}

Assistant:

int
lws_http_mark_sse(struct lws *wsi)
{
	if (!wsi)
		return 0;

	lws_http_headers_detach(wsi);
	lws_mux_mark_immortal(wsi);

	if (wsi->mux_substream)
		wsi->h2_stream_carries_sse = 1;

	return 0;
}